

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

char * get_setting(char *key)

{
  void *pvVar1;
  char *pcVar2;
  skeyval tmp;
  char *local_18 [2];
  
  local_18[0] = key;
  if ((xrmtree != (tree234 *)0x0) &&
     (pvVar1 = find234(xrmtree,local_18,(cmpfn234)0x0), pvVar1 != (void *)0x0)) {
    return *(char **)((long)pvVar1 + 8);
  }
  pcVar2 = x_get_default(key);
  return pcVar2;
}

Assistant:

static const char *get_setting(const char *key)
{
    struct skeyval tmp, *ret;
    tmp.key = key;
    if (xrmtree) {
        ret = find234(xrmtree, &tmp, NULL);
        if (ret)
            return ret->value;
    }
    return x_get_default(key);
}